

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tinyxml2.cpp
# Opt level: O0

bool tinyxml2::XMLUtil::ToInt64(char *str,int64_t *value)

{
  bool bVar1;
  int iVar2;
  undefined8 local_30;
  longlong v_1;
  unsigned_long_long v;
  int64_t *value_local;
  char *str_local;
  
  v = (unsigned_long_long)value;
  value_local = (int64_t *)str;
  bVar1 = IsPrefixHex(str);
  if (bVar1) {
    v_1 = 0;
    iVar2 = __isoc99_sscanf(value_local,"%llx",&v_1);
    if (iVar2 == 1) {
      *(longlong *)v = v_1;
      return true;
    }
  }
  else {
    local_30 = 0;
    iVar2 = __isoc99_sscanf(value_local,"%lld",&local_30);
    if (iVar2 == 1) {
      *(undefined8 *)v = local_30;
      return true;
    }
  }
  return false;
}

Assistant:

bool XMLUtil::ToInt64(const char* str, int64_t* value)
{
    if (IsPrefixHex(str)) {
        unsigned long long v = 0;	// horrible syntax trick to make the compiler happy about %llx
        if (TIXML_SSCANF(str, "%llx", &v) == 1) {
            *value = static_cast<int64_t>(v);
            return true;
        }
    }
    else {
        long long v = 0;	// horrible syntax trick to make the compiler happy about %lld
        if (TIXML_SSCANF(str, "%lld", &v) == 1) {
            *value = static_cast<int64_t>(v);
            return true;
        }
    }
	return false;
}